

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimax.hpp
# Opt level: O2

IBot<ttt::Board> * __thiscall
generic_bots::MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_>::Clone
          (MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_> *this)

{
  MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_> *this_00;
  
  this_00 = (MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_> *)
            operator_new(0x18);
  MinimaxBot(this_00,(this->super_IBot<ttt::Board>).game,this->depth);
  return &this_00->super_IBot<ttt::Board>;
}

Assistant:

game::IBot<IGame> *Clone() const
    {
        return new MinimaxBot(this->game, depth);
    }